

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

void __thiscall capnp::_::StructBuilder::copyContentFrom(StructBuilder *this,StructReader other)

{
  ushort uVar1;
  uint uVar2;
  word *pwVar3;
  uint uVar4;
  word *srcTarget;
  long lVar5;
  ulong uVar6;
  long lVar7;
  bool _kjCondition;
  ulong local_48;
  CapTableReader *local_40;
  Fault f;
  
  uVar2 = this->dataSize;
  uVar4 = other.dataSize;
  if (uVar2 < other.dataSize) {
    uVar4 = uVar2;
  }
  if ((ushort)*(uint *)&this->pointerCount < other.pointerCount) {
    other._36_4_ = *(uint *)&this->pointerCount;
  }
  if ((uVar4 == 0) || (other.data != this->data)) {
    if (((short)other._36_4_ == 0) || (other.pointers != this->pointers)) {
      if (other.dataSize < uVar2) {
        if (uVar2 == 1) {
          *(byte *)this->data = *this->data & 0xfe;
        }
        else if (7 < uVar2 - uVar4) {
          memset((void *)((ulong)(uVar4 >> 3) + (long)this->data),0,(ulong)(uVar2 - uVar4 >> 3));
        }
      }
      if (uVar4 == 1) {
        *(byte *)this->data = *this->data & 0xfe | *other.data & 1;
      }
      else if (7 < uVar4) {
        memcpy(this->data,other.data,(ulong)(uVar4 >> 3));
      }
      uVar1 = this->pointerCount;
      for (lVar7 = 0; (ulong)uVar1 * 8 != lVar7; lVar7 = lVar7 + 8) {
        WireHelpers::zeroObject
                  (this->segment,this->capTable,
                   (WirePointer *)((long)&(this->pointers->offsetAndKind).value + lVar7));
      }
      if (this->pointerCount != 0) {
        memset(this->pointers,0,(ulong)this->pointerCount << 3);
      }
      local_40 = other.capTable;
      local_48 = (ulong)(uint)other.nestingLimit;
      lVar7 = -(long)other.pointers;
      for (uVar6 = 0; (other._36_4_ & 0xffff) << 3 != uVar6; uVar6 = uVar6 + 8) {
        lVar5 = (long)(*(int *)((long)&((other.pointers)->offsetAndKind).value + uVar6) >> 2);
        if (other.segment == (SegmentReader *)0x0) {
          srcTarget = (word *)((long)&other.pointers[lVar5 + 1].offsetAndKind.value + uVar6);
        }
        else {
          pwVar3 = ((other.segment)->ptr).ptr;
          srcTarget = pwVar3 + ((other.segment)->ptr).size_;
          if (((long)&pwVar3[-1].content + lVar7 >> 3 <= lVar5) &&
             (lVar5 <= (long)&srcTarget[-1].content + lVar7 >> 3)) {
            srcTarget = (word *)((long)&other.pointers[lVar5 + 1].offsetAndKind.value + uVar6);
          }
        }
        WireHelpers::copyPointer
                  (this->segment,this->capTable,
                   (WirePointer *)((long)&(this->pointers->offsetAndKind).value + uVar6),
                   other.segment,local_40,
                   (WirePointer *)((long)&((other.pointers)->offsetAndKind).value + uVar6),srcTarget
                   ,(int)local_48,(BuilderArena *)0x0,false);
        lVar7 = lVar7 + -8;
      }
      return;
    }
    if ((uVar4 != 0) && (other.data != this->data)) {
      _kjCondition = false;
      goto LAB_002e9dd0;
    }
  }
  else if ((short)other._36_4_ == 0) {
    return;
  }
  _kjCondition = other.pointers == this->pointers;
  if (_kjCondition) {
    return;
  }
LAB_002e9dd0:
  kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
             ,0xb62,FAILED,
             "(sharedDataSize == ZERO * BITS || other.data == data) && (sharedPointerCount == ZERO * POINTERS || other.pointers == pointers)"
             ,"_kjCondition,",&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void StructBuilder::copyContentFrom(StructReader other) {
  // Determine the amount of data the builders have in common.
  auto sharedDataSize = kj::min(dataSize, other.dataSize);
  auto sharedPointerCount = kj::min(pointerCount, other.pointerCount);

  if ((sharedDataSize > ZERO * BITS && other.data == data) ||
      (sharedPointerCount > ZERO * POINTERS && other.pointers == pointers)) {
    // At least one of the section pointers is pointing to ourself. Verify that the other is two
    // (but ignore empty sections).
    KJ_ASSERT((sharedDataSize == ZERO * BITS || other.data == data) &&
              (sharedPointerCount == ZERO * POINTERS || other.pointers == pointers));
    // So `other` appears to be a reader for this same struct. No coping is needed.
    return;
  }

  if (dataSize > sharedDataSize) {
    // Since the target is larger than the source, make sure to zero out the extra bits that the
    // source doesn't have.
    if (dataSize == ONE * BITS) {
      setDataField<bool>(ZERO * ELEMENTS, false);
    } else {
      byte* unshared = reinterpret_cast<byte*>(data) + sharedDataSize / BITS_PER_BYTE;
      WireHelpers::zeroMemory(unshared,
          subtractChecked(dataSize, sharedDataSize, []() {}) / BITS_PER_BYTE);
    }
  }

  // Copy over the shared part.
  if (sharedDataSize == ONE * BITS) {
    setDataField<bool>(ZERO * ELEMENTS, other.getDataField<bool>(ZERO * ELEMENTS));
  } else {
    WireHelpers::copyMemory(reinterpret_cast<byte*>(data),
                            reinterpret_cast<const byte*>(other.data),
                            sharedDataSize / BITS_PER_BYTE);
  }

  // Zero out all pointers in the target.
  for (auto i: kj::zeroTo(pointerCount)) {
    WireHelpers::zeroObject(segment, capTable, pointers + i);
  }
  WireHelpers::zeroMemory(pointers, pointerCount);

  // Copy the pointers.
  for (auto i: kj::zeroTo(sharedPointerCount)) {
    WireHelpers::copyPointer(segment, capTable, pointers + i,
        other.segment, other.capTable, other.pointers + i, other.nestingLimit);
  }
}